

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderRenderingPointsCase::~GeometryShaderRenderingPointsCase
          (GeometryShaderRenderingPointsCase *this)

{
  (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderingPointsCase_01df9240;
  if (this->m_raw_array_data != (float *)0x0) {
    operator_delete__(this->m_raw_array_data);
    this->m_raw_array_data = (float *)0x0;
  }
  if (this->m_unordered_array_data != (float *)0x0) {
    operator_delete__(this->m_unordered_array_data);
    this->m_unordered_array_data = (float *)0x0;
  }
  if (this->m_unordered_elements_data != (uchar *)0x0) {
    operator_delete__(this->m_unordered_elements_data);
    this->m_unordered_elements_data = (uchar *)0x0;
  }
  TestCaseBase::~TestCaseBase((TestCaseBase *)this);
  return;
}

Assistant:

GeometryShaderRenderingPointsCase::~GeometryShaderRenderingPointsCase()
{
	if (m_raw_array_data != NULL)
	{
		delete[] m_raw_array_data;

		m_raw_array_data = NULL;
	}

	if (m_unordered_array_data != NULL)
	{
		delete[] m_unordered_array_data;

		m_unordered_array_data = NULL;
	}

	if (m_unordered_elements_data != NULL)
	{
		delete[] m_unordered_elements_data;

		m_unordered_elements_data = NULL;
	}
}